

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowOuterBorders(ImGuiWindow *window)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  int border_n;
  int iVar3;
  float fVar4;
  float fVar5;
  ImRect IVar6;
  ImVec2 local_bc;
  ImVec2 local_b4;
  float local_ac;
  ImVec2 IStack_a8;
  float y;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImRect border_r;
  ImGuiResizeBorderDef *def;
  ImVec2 IStack_28;
  int border_held;
  float local_20;
  float local_1c;
  float border_size;
  float rounding;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  _border_size = GImGui;
  local_1c = window->WindowRounding;
  local_20 = window->WindowBorderSize;
  g = (ImGuiContext *)window;
  if ((0.0 < local_20) && ((window->Flags & 0x80U) == 0)) {
    pIVar1 = window->DrawList;
    IStack_28 = ::operator+(&window->Pos,&window->Size);
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&window->Pos,&stack0xffffffffffffffd8,IVar2,local_1c,0xf,local_20);
  }
  border_n = (int)*(char *)((long)(g->IO).KeyMap + 0x4b);
  if (border_n != -1) {
    if (RenderWindowOuterBorders(ImGuiWindow*)::resize_border_def == '\0') {
      iVar3 = __cxa_guard_acquire(&RenderWindowOuterBorders(ImGuiWindow*)::resize_border_def);
      if (iVar3 != 0) {
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[0].InnerDir,0.0,1.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[0].CornerPosN1,0.0,0.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[0].CornerPosN2,1.0,0.0);
        RenderWindowOuterBorders::resize_border_def[0].OuterAngle = 4.712389;
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[1].InnerDir,-1.0,0.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[1].CornerPosN1,1.0,0.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[1].CornerPosN2,1.0,1.0);
        RenderWindowOuterBorders::resize_border_def[1].OuterAngle = 0.0;
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[2].InnerDir,0.0,-1.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[2].CornerPosN1,1.0,1.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[2].CornerPosN2,0.0,1.0);
        RenderWindowOuterBorders::resize_border_def[2].OuterAngle = 1.5707964;
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[3].InnerDir,1.0,0.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[3].CornerPosN1,0.0,1.0);
        ImVec2::ImVec2(&RenderWindowOuterBorders::resize_border_def[3].CornerPosN2,0.0,0.0);
        RenderWindowOuterBorders::resize_border_def[3].OuterAngle = 3.1415927;
        __cxa_guard_release(&RenderWindowOuterBorders(ImGuiWindow*)::resize_border_def);
      }
    }
    border_r.Max = (ImVec2)(RenderWindowOuterBorders::resize_border_def + border_n);
    IVar6 = GetResizeBorderRect((ImGuiWindow *)g,border_n,local_1c,0.0);
    border_r.Min = IVar6.Max;
    local_58 = IVar6.Min;
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x164);
    local_70 = ImLerp(&local_58,&border_r.Min,(ImVec2 *)((long)border_r.Max + 8));
    ImVec2::ImVec2(&local_78,0.5,0.5);
    local_68 = ::operator+(&local_70,&local_78);
    local_80 = ::operator*((ImVec2 *)border_r.Max,local_1c);
    local_60 = ::operator+(&local_68,&local_80);
    ImDrawList::PathArcTo
              (pIVar1,&local_60,local_1c,*(float *)((long)border_r.Max + 0x18) + -0.7853982,
               *(float *)((long)border_r.Max + 0x18),10);
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x164);
    local_98 = ImLerp(&local_58,&border_r.Min,(ImVec2 *)((long)border_r.Max + 0x10));
    ImVec2::ImVec2(&local_a0,0.5,0.5);
    local_90 = ::operator+(&local_98,&local_a0);
    IStack_a8 = ::operator*((ImVec2 *)border_r.Max,local_1c);
    local_88 = ::operator+(&local_90,&stack0xffffffffffffff58);
    ImDrawList::PathArcTo
              (pIVar1,&local_88,local_1c,*(float *)((long)border_r.Max + 0x18),
               *(float *)((long)border_r.Max + 0x18) + 0.7853982,10);
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x164);
    IVar2 = GetColorU32(0x1d,1.0);
    fVar4 = ImMax<float>(2.0,local_20);
    ImDrawList::PathStroke(pIVar1,IVar2,false,fVar4);
  }
  if ((0.0 < (_border_size->Style).FrameBorderSize) && (((g->IO).BackendFlags & 1U) == 0)) {
    fVar4 = (g->IO).DisplaySize.y;
    fVar5 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)g);
    local_ac = (fVar4 + fVar5) - 1.0;
    pIVar1 = *(ImDrawList **)((g->IO).KeysDown + 0x164);
    ImVec2::ImVec2(&local_b4,(g->IO).DisplaySize.x + local_20,local_ac);
    ImVec2::ImVec2(&local_bc,((g->IO).DisplaySize.x + (g->IO).DeltaTime) - local_20,local_ac);
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddLine(pIVar1,&local_b4,&local_bc,IVar2,(_border_size->Style).FrameBorderSize);
  }
  return;
}

Assistant:

static void ImGui::RenderWindowOuterBorders(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    float rounding = window->WindowRounding;
    float border_size = window->WindowBorderSize;
    if (border_size > 0.0f && !(window->Flags & ImGuiWindowFlags_NoBackground))
        window->DrawList->AddRect(window->Pos, window->Pos + window->Size, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);

    int border_held = window->ResizeBorderHeld;
    if (border_held != -1)
    {
        struct ImGuiResizeBorderDef
        {
            ImVec2 InnerDir;
            ImVec2 CornerPosN1, CornerPosN2;
            float  OuterAngle;
        };
        static const ImGuiResizeBorderDef resize_border_def[4] =
        {
            { ImVec2(0,+1), ImVec2(0,0), ImVec2(1,0), IM_PI*1.50f }, // Top
            { ImVec2(-1,0), ImVec2(1,0), ImVec2(1,1), IM_PI*0.00f }, // Right
            { ImVec2(0,-1), ImVec2(1,1), ImVec2(0,1), IM_PI*0.50f }, // Bottom
            { ImVec2(+1,0), ImVec2(0,1), ImVec2(0,0), IM_PI*1.00f }  // Left
        };
        const ImGuiResizeBorderDef& def = resize_border_def[border_held];
        ImRect border_r = GetResizeBorderRect(window, border_held, rounding, 0.0f);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.CornerPosN1) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle - IM_PI*0.25f, def.OuterAngle);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.CornerPosN2) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle, def.OuterAngle + IM_PI*0.25f);
        window->DrawList->PathStroke(GetColorU32(ImGuiCol_SeparatorActive), false, ImMax(2.0f, border_size)); // Thicker than usual
    }
    if (g.Style.FrameBorderSize > 0 && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
    {
        float y = window->Pos.y + window->TitleBarHeight() - 1;
        window->DrawList->AddLine(ImVec2(window->Pos.x + border_size, y), ImVec2(window->Pos.x + window->Size.x - border_size, y), GetColorU32(ImGuiCol_Border), g.Style.FrameBorderSize);
    }
}